

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte typecode;
  ushort key;
  _Bool _Var1;
  container_t *pcVar2;
  container_t *pcVar3;
  ushort *puVar4;
  uint uVar5;
  int iVar6;
  uint8_t type1;
  int i;
  ulong uVar7;
  long lVar8;
  uint16_t uVar9;
  uint start_index;
  uint uVar10;
  ulong uVar11;
  uint8_t type2;
  uint8_t result_type;
  roaring_array_t *local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  result_type = '\0';
  local_3c = (x2->high_low_container).size;
  if (local_3c != 0) {
    uVar5 = (x1->high_low_container).size;
    if (uVar5 == 0) {
      roaring_bitmap_overwrite(x1,x2);
      return;
    }
    uVar9 = *(x1->high_low_container).keys;
    puVar4 = (x2->high_low_container).keys;
    iVar6 = uVar5 - 1;
    uVar11 = 0;
    lVar8 = 0;
    local_48 = &x2->high_low_container;
LAB_0010621d:
    local_38 = (ulong)uVar5;
    while( true ) {
      start_index = (uint)uVar11;
      key = *puVar4;
      uVar7 = (ulong)(int)lVar8;
      while( true ) {
        i = (int)uVar7;
        if (uVar9 == key) break;
        if (key <= uVar9) {
          type2 = local_48->typecodes[uVar11 & 0xffff];
          pcVar3 = get_copy_of_container
                             (local_48->containers[uVar11 & 0xffff],&type2,
                              (_Bool)(local_48->flags & 1));
          if ((local_48->flags & 1) != 0) {
            local_48->containers[(int)start_index] = pcVar3;
            local_48->typecodes[(int)start_index] = type2;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,i,key,pcVar3,type2);
          uVar5 = (int)local_38 + 1;
          uVar10 = start_index + 1;
          uVar11 = (ulong)uVar10;
          start_index = local_3c;
          if (uVar10 == local_3c) goto LAB_001063e4;
          lVar8 = uVar7 + 1;
          puVar4 = (ushort *)((ulong)((uVar10 & 0xffff) * 2) + (long)local_48->keys);
          iVar6 = iVar6 + 1;
          goto LAB_0010621d;
        }
        if (iVar6 == i) goto LAB_001063e9;
        uVar7 = uVar7 + 1;
        uVar9 = (x1->high_low_container).keys[uVar7 & 0xffff];
      }
      typecode = (x1->high_low_container).typecodes[uVar7 & 0xffff];
      pcVar3 = (x1->high_low_container).containers[uVar7 & 0xffff];
      local_40 = (uint)typecode;
      _Var1 = container_is_full(pcVar3,typecode);
      if (!_Var1) {
        type2 = local_48->typecodes[uVar11 & 0xffff];
        if (typecode == 4) {
          pcVar2 = container_or(pcVar3,'\x04',local_48->containers[uVar11 & 0xffff],type2,
                                &result_type);
          type1 = (uint8_t)local_40;
        }
        else {
          type1 = (uint8_t)local_40;
          pcVar2 = container_ior(pcVar3,type1,local_48->containers[uVar11 & 0xffff],type2,
                                 &result_type);
        }
        if (pcVar2 != pcVar3) {
          container_free(pcVar3,type1);
        }
        (x1->high_low_container).containers[uVar7] = pcVar2;
        (x1->high_low_container).typecodes[uVar7] = result_type;
      }
      start_index = start_index + 1;
      uVar11 = (ulong)start_index;
      if ((iVar6 == i) || (start_index == local_3c)) break;
      lVar8 = uVar7 + 1;
      uVar9 = (x1->high_low_container).keys[(uint)lVar8 & 0xffff];
      puVar4 = (ushort *)((ulong)((start_index & 0xffff) * 2) + (long)local_48->keys);
    }
    uVar5 = (uint)local_38;
LAB_001063e4:
    if (i + 1U == uVar5) {
LAB_001063e9:
      ra_append_copy_range
                (&x1->high_low_container,local_48,start_index,local_3c,(_Bool)(local_48->flags & 1))
      ;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}